

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

char * lowstring(char *i)

{
  char cVar1;
  char *o;
  char *i_local;
  
  o = lowstring::lowbuf;
  for (i_local = i; *i_local != '\0' && (int)o - 0x9585e0U < 0x11ff; i_local = i_local + 1) {
    if ((*i_local < 'A') || ('Z' < *i_local)) {
      cVar1 = *i_local;
    }
    else {
      cVar1 = *i_local + ' ';
    }
    *o = cVar1;
    o = o + 1;
  }
  *o = '\0';
  return lowstring::lowbuf;
}

Assistant:

const char *lowstring(const char *i)
{
	static char lowbuf[MAX_STRING_LENGTH];
	char *o;

	for (o = lowbuf; *i && (unsigned int)(o - lowbuf) < sizeof(lowbuf) - 1; i++, o++)
	{
		*o = LOWER(*i);
	}

	*o = '\0';
	return lowbuf;
}